

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileImporter.cpp
# Opt level: O0

void __thiscall
Assimp::ObjFileImporter::createVertexArray
          (ObjFileImporter *this,Model *pModel,Object *pCurrentObject,uint uiMeshIndex,aiMesh *pMesh
          ,uint numIndices)

{
  aiFace *paVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  size_t sVar7;
  Face *pFVar8;
  uint uVar9;
  bool bVar10;
  uint uVar11;
  const_reference ppMVar12;
  DeadlyImportError *pDVar13;
  ulong uVar14;
  ulong uVar15;
  aiVector3D *paVar16;
  aiColor4D *paVar17;
  Face *pFVar18;
  reference ppFVar19;
  size_type sVar20;
  reference pvVar21;
  const_reference pvVar22;
  aiVector3D *paVar23;
  aiVector3t<float> *local_220;
  aiColor4t<float> *local_1f8;
  aiVector3t<float> *local_1d0;
  aiVector3t<float> *local_1a8;
  ulong local_170;
  size_t i;
  bool last;
  aiFace *pDestFace;
  undefined4 uStack_150;
  float local_14c;
  const_reference local_148;
  aiVector3D *coord3d;
  float fStack_138;
  uint tex;
  float local_130;
  float fStack_12c;
  const_reference local_128;
  aiVector3D *color;
  uint normal;
  undefined1 local_f2;
  allocator<char> local_f1;
  string local_f0;
  uint local_cc;
  long lStack_c8;
  uint vertex;
  size_t outVertexIndex;
  size_t vertexIndex;
  Face *pSourceFace;
  size_t index;
  uint local_a0;
  uint outIndex;
  uint newIndex;
  bool uvok;
  bool normalsok;
  undefined1 local_75;
  allocator<char> local_61;
  string local_60;
  value_type local_40;
  Mesh *pObjMesh;
  aiMesh *paStack_30;
  uint numIndices_local;
  aiMesh *pMesh_local;
  Object *pOStack_20;
  uint uiMeshIndex_local;
  Object *pCurrentObject_local;
  Model *pModel_local;
  ObjFileImporter *this_local;
  
  pObjMesh._4_4_ = numIndices;
  paStack_30 = pMesh;
  pMesh_local._4_4_ = uiMeshIndex;
  pOStack_20 = pCurrentObject;
  pCurrentObject_local = (Object *)pModel;
  pModel_local = (Model *)this;
  if (pCurrentObject == (Object *)0x0) {
    __assert_fail("__null != pCurrentObject",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Obj/ObjFileImporter.cpp"
                  ,0x19a,
                  "void Assimp::ObjFileImporter::createVertexArray(const ObjFile::Model *, const ObjFile::Object *, unsigned int, aiMesh *, unsigned int)"
                 );
  }
  bVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                     (&pCurrentObject->m_Meshes);
  if (!bVar10) {
    ppMVar12 = std::vector<Assimp::ObjFile::Mesh_*,_std::allocator<Assimp::ObjFile::Mesh_*>_>::
               operator[]((vector<Assimp::ObjFile::Mesh_*,_std::allocator<Assimp::ObjFile::Mesh_*>_>
                           *)&pCurrentObject_local[2].m_strObjName.field_2,(ulong)pMesh_local._4_4_)
    ;
    local_40 = *ppMVar12;
    if ((local_40 != (value_type)0x0) && (local_40->m_uiNumIndices != 0)) {
      paStack_30->mNumVertices = pObjMesh._4_4_;
      if (paStack_30->mNumVertices == 0) {
        local_75 = 1;
        pDVar13 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_60,"OBJ: no vertices",&local_61);
        DeadlyImportError::DeadlyImportError(pDVar13,&local_60);
        local_75 = 0;
        __cxa_throw(pDVar13,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      if (0x7fffffff < paStack_30->mNumVertices) {
        outIndex._2_1_ = 1;
        pDVar13 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&newIndex,"OBJ: Too many vertices",
                   (allocator<char> *)((long)&outIndex + 3));
        DeadlyImportError::DeadlyImportError(pDVar13,(string *)&newIndex);
        outIndex._2_1_ = 0;
        __cxa_throw(pDVar13,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      uVar14 = CONCAT44(0,paStack_30->mNumVertices);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar14;
      uVar15 = SUB168(auVar2 * ZEXT816(0xc),0);
      if (SUB168(auVar2 * ZEXT816(0xc),8) != 0) {
        uVar15 = 0xffffffffffffffff;
      }
      paVar16 = (aiVector3D *)operator_new__(uVar15);
      if (uVar14 != 0) {
        local_1a8 = paVar16;
        do {
          aiVector3t<float>::aiVector3t(local_1a8);
          local_1a8 = local_1a8 + 1;
        } while (local_1a8 != paVar16 + uVar14);
      }
      paStack_30->mVertices = paVar16;
      bVar10 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                          &(pCurrentObject_local->m_Meshes).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish);
      if ((!bVar10) && ((local_40->m_hasNormals & 1U) != 0)) {
        uVar14 = CONCAT44(0,paStack_30->mNumVertices);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar14;
        uVar15 = SUB168(auVar3 * ZEXT816(0xc),0);
        if (SUB168(auVar3 * ZEXT816(0xc),8) != 0) {
          uVar15 = 0xffffffffffffffff;
        }
        paVar16 = (aiVector3D *)operator_new__(uVar15);
        if (uVar14 != 0) {
          local_1d0 = paVar16;
          do {
            aiVector3t<float>::aiVector3t(local_1d0);
            local_1d0 = local_1d0 + 1;
          } while (local_1d0 != paVar16 + uVar14);
        }
        paStack_30->mNormals = paVar16;
      }
      bVar10 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                          &pCurrentObject_local[1].m_strObjName._M_string_length);
      if (!bVar10) {
        uVar14 = CONCAT44(0,paStack_30->mNumVertices);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar14;
        uVar15 = SUB168(auVar4 * ZEXT816(0x10),0);
        if (SUB168(auVar4 * ZEXT816(0x10),8) != 0) {
          uVar15 = 0xffffffffffffffff;
        }
        paVar17 = (aiColor4D *)operator_new__(uVar15);
        if (uVar14 != 0) {
          local_1f8 = paVar17;
          do {
            aiColor4t<float>::aiColor4t(local_1f8);
            local_1f8 = local_1f8 + 1;
          } while (local_1f8 != paVar17 + uVar14);
        }
        paStack_30->mColors[0] = paVar17;
      }
      bVar10 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                          &pCurrentObject_local[1].m_Meshes);
      if ((!bVar10) && (local_40->m_uiUVCoordinates[0] != 0)) {
        paStack_30->mNumUVComponents[0] = *(uint *)&pCurrentObject_local[2].m_strObjName;
        uVar14 = CONCAT44(0,paStack_30->mNumVertices);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar14;
        uVar15 = SUB168(auVar5 * ZEXT816(0xc),0);
        if (SUB168(auVar5 * ZEXT816(0xc),8) != 0) {
          uVar15 = 0xffffffffffffffff;
        }
        paVar16 = (aiVector3D *)operator_new__(uVar15);
        if (uVar14 != 0) {
          local_220 = paVar16;
          do {
            aiVector3t<float>::aiVector3t(local_220);
            local_220 = local_220 + 1;
          } while (local_220 != paVar16 + uVar14);
        }
        paStack_30->mTextureCoords[0] = paVar16;
      }
      outIndex._1_1_ = 1;
      outIndex._0_1_ = 1;
      local_a0 = 0;
      index._4_4_ = 0;
      for (pSourceFace = (Face *)0x0; pFVar8 = pSourceFace,
          pFVar18 = (Face *)std::
                            vector<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                            ::size(&local_40->m_Faces), pFVar8 < pFVar18;
          pSourceFace = (Face *)((long)&pSourceFace->m_PrimitiveType + 1)) {
        ppFVar19 = std::vector<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>::
                   operator[](&local_40->m_Faces,(size_type)pSourceFace);
        vertexIndex = (size_t)*ppFVar19;
        lStack_c8 = 0;
        for (outVertexIndex = 0; sVar7 = outVertexIndex,
            sVar20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                (vertexIndex + 8)), sVar7 < sVar20;
            outVertexIndex = outVertexIndex + 1) {
          pvVar21 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               (vertexIndex + 8),outVertexIndex);
          local_cc = *pvVar21;
          uVar14 = (ulong)local_cc;
          sVar20 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                             ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                              &(pCurrentObject_local->m_SubObjects).
                               super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
          if (sVar20 <= uVar14) {
            local_f2 = 1;
            pDVar13 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_f0,"OBJ: vertex index out of range",&local_f1);
            DeadlyImportError::DeadlyImportError(pDVar13,&local_f0);
            local_f2 = 0;
            __cxa_throw(pDVar13,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
          }
          if (paStack_30->mNumVertices <= local_a0) {
            color._6_1_ = 1;
            pDVar13 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&normal,"OBJ: bad vertex index",
                       (allocator<char> *)((long)&color + 7));
            DeadlyImportError::DeadlyImportError(pDVar13,(string *)&normal);
            color._6_1_ = 0;
            __cxa_throw(pDVar13,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
          }
          pvVar22 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                               &(pCurrentObject_local->m_SubObjects).
                                super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish,(ulong)local_cc);
          paVar16 = paStack_30->mVertices + local_a0;
          fVar6 = pvVar22->y;
          paVar16->x = pvVar22->x;
          paVar16->y = fVar6;
          paVar16->z = pvVar22->z;
          if ((((outIndex._1_1_ & 1) != 0) &&
              (bVar10 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *
                                   )&(pCurrentObject_local->m_Meshes).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish),
              sVar7 = outVertexIndex, !bVar10)) &&
             (sVar20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  (vertexIndex + 0x20)), sVar7 < sVar20)) {
            pvVar21 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 (vertexIndex + 0x20),outVertexIndex);
            color._0_4_ = *pvVar21;
            uVar14 = (ulong)(uint)color;
            sVar20 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                               ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                                &(pCurrentObject_local->m_Meshes).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish);
            if (uVar14 < sVar20) {
              pvVar22 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::
                        operator[]((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *
                                   )&(pCurrentObject_local->m_Meshes).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,(ulong)(uint)color);
              paVar16 = paStack_30->mNormals + local_a0;
              fVar6 = pvVar22->y;
              paVar16->x = pvVar22->x;
              paVar16->y = fVar6;
              paVar16->z = pvVar22->z;
            }
            else {
              outIndex._1_1_ = 0;
            }
          }
          bVar10 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                             ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                              &pCurrentObject_local[1].m_strObjName._M_string_length);
          if (!bVar10) {
            local_128 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::
                        operator[]((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *
                                   )&pCurrentObject_local[1].m_strObjName._M_string_length,
                                   (ulong)local_cc);
            aiColor4t<float>::aiColor4t
                      ((aiColor4t<float> *)&stack0xfffffffffffffec8,local_128->x,local_128->y,
                       local_128->z,1.0);
            paVar17 = paStack_30->mColors[0] + local_a0;
            paVar17->r = fStack_138;
            paVar17->g = (float)tex;
            paVar17->b = local_130;
            paVar17->a = fStack_12c;
          }
          if (((((byte)outIndex & 1) != 0) &&
              (bVar10 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *
                                   )&pCurrentObject_local[1].m_Meshes), sVar7 = outVertexIndex,
              !bVar10)) &&
             (sVar20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  (vertexIndex + 0x38)), sVar7 < sVar20)) {
            pvVar21 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 (vertexIndex + 0x38),outVertexIndex);
            coord3d._4_4_ = *pvVar21;
            uVar14 = (ulong)coord3d._4_4_;
            sVar20 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                               ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                                &pCurrentObject_local[1].m_Meshes);
            if (uVar14 < sVar20) {
              local_148 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::
                          operator[]((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      *)&pCurrentObject_local[1].m_Meshes,(ulong)coord3d._4_4_);
              aiVector3t<float>::aiVector3t
                        ((aiVector3t<float> *)((long)&pDestFace + 4),local_148->x,local_148->y,
                         local_148->z);
              paVar16 = paStack_30->mTextureCoords[0] + local_a0;
              paVar16->x = (float)pDestFace._4_4_;
              paVar16->y = (float)uStack_150;
              paVar16->z = local_14c;
            }
            else {
              outIndex._0_1_ = 0;
            }
          }
          uVar9 = index._4_4_;
          sVar7 = outVertexIndex;
          paVar1 = paStack_30->mFaces;
          sVar20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              (vertexIndex + 8));
          bVar10 = sVar7 == sVar20 - 1;
          if ((*(int *)vertexIndex != 2) || (!bVar10)) {
            paVar1[uVar9].mIndices[lStack_c8] = local_a0;
            lStack_c8 = lStack_c8 + 1;
          }
          if (*(int *)vertexIndex == 1) {
            index._4_4_ = index._4_4_ + 1;
            lStack_c8 = 0;
          }
          else if (*(int *)vertexIndex == 2) {
            lStack_c8 = 0;
            if (!bVar10) {
              index._4_4_ = index._4_4_ + 1;
            }
            if (outVertexIndex != 0) {
              if (!bVar10) {
                paVar23 = paStack_30->mVertices + local_a0;
                paVar16 = paStack_30->mVertices + (local_a0 + 1);
                fVar6 = paVar23->y;
                paVar16->x = paVar23->x;
                paVar16->y = fVar6;
                paVar16->z = paVar23->z;
                bVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                    (vertexIndex + 0x20));
                if ((!bVar10) &&
                   (bVar10 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::
                             empty((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *
                                   )&(pCurrentObject_local->m_Meshes).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish), !bVar10)) {
                  paVar23 = paStack_30->mNormals + local_a0;
                  paVar16 = paStack_30->mNormals + (local_a0 + 1);
                  fVar6 = paVar23->y;
                  paVar16->x = paVar23->x;
                  paVar16->y = fVar6;
                  paVar16->z = paVar23->z;
                }
                bVar10 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                                   ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                     *)&pCurrentObject_local[1].m_Meshes);
                if (!bVar10) {
                  for (local_170 = 0; uVar11 = aiMesh::GetNumUVChannels(paStack_30),
                      local_170 < uVar11; local_170 = local_170 + 1) {
                    paVar23 = paStack_30->mTextureCoords[local_170] + local_a0;
                    paVar16 = paStack_30->mTextureCoords[local_170] + (local_a0 + 1);
                    fVar6 = paVar23->y;
                    paVar16->x = paVar23->x;
                    paVar16->y = fVar6;
                    paVar16->z = paVar23->z;
                  }
                }
                local_a0 = local_a0 + 1;
              }
              paVar1[(ulong)uVar9 - 1].mIndices[1] = local_a0;
            }
          }
          else if (bVar10) {
            index._4_4_ = index._4_4_ + 1;
          }
          local_a0 = local_a0 + 1;
        }
      }
      if ((outIndex._1_1_ & 1) == 0) {
        if (paStack_30->mNormals != (aiVector3D *)0x0) {
          operator_delete__(paStack_30->mNormals);
        }
        paStack_30->mNormals = (aiVector3D *)0x0;
      }
      if (((byte)outIndex & 1) == 0) {
        if (paStack_30->mTextureCoords[0] != (aiVector3D *)0x0) {
          operator_delete__(paStack_30->mTextureCoords[0]);
        }
        paStack_30->mTextureCoords[0] = (aiVector3D *)0x0;
      }
    }
  }
  return;
}

Assistant:

void ObjFileImporter::createVertexArray(const ObjFile::Model* pModel,
                                        const ObjFile::Object* pCurrentObject,
                                        unsigned int uiMeshIndex,
                                        aiMesh* pMesh,
                                        unsigned int numIndices) {
    // Checking preconditions
    ai_assert( NULL != pCurrentObject );

    // Break, if no faces are stored in object
    if ( pCurrentObject->m_Meshes.empty() )
        return;

    // Get current mesh
    ObjFile::Mesh *pObjMesh = pModel->m_Meshes[ uiMeshIndex ];
    if ( NULL == pObjMesh || pObjMesh->m_uiNumIndices < 1 ) {
        return;
    }

    // Copy vertices of this mesh instance
    pMesh->mNumVertices = numIndices;
    if (pMesh->mNumVertices == 0) {
        throw DeadlyImportError( "OBJ: no vertices" );
    } else if (pMesh->mNumVertices > AI_MAX_VERTICES) {
        throw DeadlyImportError( "OBJ: Too many vertices" );
    }
    pMesh->mVertices = new aiVector3D[ pMesh->mNumVertices ];

    // Allocate buffer for normal vectors
    if ( !pModel->m_Normals.empty() && pObjMesh->m_hasNormals )
        pMesh->mNormals = new aiVector3D[ pMesh->mNumVertices ];

    // Allocate buffer for vertex-color vectors
    if ( !pModel->m_VertexColors.empty() )
        pMesh->mColors[0] = new aiColor4D[ pMesh->mNumVertices ];

    // Allocate buffer for texture coordinates
    if ( !pModel->m_TextureCoord.empty() && pObjMesh->m_uiUVCoordinates[0] )
    {
        pMesh->mNumUVComponents[ 0 ] = pModel->m_TextureCoordDim;
        pMesh->mTextureCoords[ 0 ] = new aiVector3D[ pMesh->mNumVertices ];
    }

    // Copy vertices, normals and textures into aiMesh instance
    bool normalsok = true, uvok = true;
    unsigned int newIndex = 0, outIndex = 0;
    for ( size_t index=0; index < pObjMesh->m_Faces.size(); index++ ) {
        // Get source face
        ObjFile::Face *pSourceFace = pObjMesh->m_Faces[ index ];

        // Copy all index arrays
        for ( size_t vertexIndex = 0, outVertexIndex = 0; vertexIndex < pSourceFace->m_vertices.size(); vertexIndex++ ) {
            const unsigned int vertex = pSourceFace->m_vertices.at( vertexIndex );
            if ( vertex >= pModel->m_Vertices.size() ) {
                throw DeadlyImportError( "OBJ: vertex index out of range" );
            }

            if ( pMesh->mNumVertices <= newIndex ) {
                throw DeadlyImportError("OBJ: bad vertex index");
            }

            pMesh->mVertices[ newIndex ] = pModel->m_Vertices[ vertex ];

            // Copy all normals
            if ( normalsok && !pModel->m_Normals.empty() && vertexIndex < pSourceFace->m_normals.size()) {
                const unsigned int normal = pSourceFace->m_normals.at( vertexIndex );
                if ( normal >= pModel->m_Normals.size() )
                {
                    normalsok = false;
                }
                else
                {
                    pMesh->mNormals[ newIndex ] = pModel->m_Normals[ normal ];
                }
            }

            // Copy all vertex colors
            if ( !pModel->m_VertexColors.empty())
            {
                const aiVector3D& color = pModel->m_VertexColors[ vertex ];
                pMesh->mColors[0][ newIndex ] = aiColor4D(color.x, color.y, color.z, 1.0);
            }

            // Copy all texture coordinates
            if ( uvok && !pModel->m_TextureCoord.empty() && vertexIndex < pSourceFace->m_texturCoords.size())
            {
                const unsigned int tex = pSourceFace->m_texturCoords.at( vertexIndex );

                if ( tex >= pModel->m_TextureCoord.size() )
                {
                    uvok = false;
                }
                else
                {
                    const aiVector3D &coord3d = pModel->m_TextureCoord[ tex ];
                    pMesh->mTextureCoords[ 0 ][ newIndex ] = aiVector3D( coord3d.x, coord3d.y, coord3d.z );
                }
            }

            // Get destination face
            aiFace *pDestFace = &pMesh->mFaces[ outIndex ];

            const bool last = ( vertexIndex == pSourceFace->m_vertices.size() - 1 );
            if (pSourceFace->m_PrimitiveType != aiPrimitiveType_LINE || !last) {
                pDestFace->mIndices[ outVertexIndex ] = newIndex;
                outVertexIndex++;
            }

            if (pSourceFace->m_PrimitiveType == aiPrimitiveType_POINT) {
                outIndex++;
                outVertexIndex = 0;
            } else if (pSourceFace->m_PrimitiveType == aiPrimitiveType_LINE) {
                outVertexIndex = 0;

                if(!last)
                    outIndex++;

                if (vertexIndex) {
                    if(!last) {
                        pMesh->mVertices[ newIndex+1 ] = pMesh->mVertices[ newIndex ];
                        if ( !pSourceFace->m_normals.empty() && !pModel->m_Normals.empty()) {
                            pMesh->mNormals[ newIndex+1 ] = pMesh->mNormals[newIndex ];
                        }
                        if ( !pModel->m_TextureCoord.empty() ) {
                            for ( size_t i=0; i < pMesh->GetNumUVChannels(); i++ ) {
                                pMesh->mTextureCoords[ i ][ newIndex+1 ] = pMesh->mTextureCoords[ i ][ newIndex ];
                            }
                        }
                        ++newIndex;
                    }

                    pDestFace[-1].mIndices[1] = newIndex;
                }
            }
            else if (last) {
                outIndex++;
            }
            ++newIndex;
        }
    }

    if (!normalsok)
    {
        delete [] pMesh->mNormals;
        pMesh->mNormals = nullptr;
    }

    if (!uvok)
    {
        delete [] pMesh->mTextureCoords[0];
        pMesh->mTextureCoords[0] = nullptr;
    }
}